

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

bool __thiscall Hpipe::Lexer::assemble_larg(Lexer *this,Lexem *o)

{
  Lexem *o_local;
  Lexer *this_local;
  
  if (o->prev == (Lexem *)0x0) {
    this_local._7_1_ = err(this,o,"Operator needs a left expression.");
  }
  else {
    if (o->prev->parent != (Lexem *)0x0) {
      o->parent = o->prev->parent;
      if (o->prev->parent->children[0] == o->prev) {
        o->prev->parent->children[0] = o;
      }
      else {
        o->prev->parent->children[1] = o;
      }
    }
    if (o->prev->prev != (Lexem *)0x0) {
      o->prev->prev->next = o;
    }
    o->children[0] = o->prev;
    o->children[0]->parent = o;
    o->prev = o->prev->prev;
    o->children[0]->next = (Lexem *)0x0;
    o->children[0]->prev = (Lexem *)0x0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Lexer::assemble_larg( Lexem *o ) {
    if ( not o->prev )
        return err( o, "Operator needs a left expression." );
    if ( o->prev->parent ) {
        o->parent = o->prev->parent;
        if (o->prev->parent->children[ 0 ] == o->prev)
            o->prev->parent->children[ 0 ] = o;
        else
            o->prev->parent->children[ 1 ] = o;
    }
    if ( o->prev->prev )
        o->prev->prev->next = o;

    o->children[ 0 ] = o->prev;
    o->children[ 0 ]->parent = o;
    o->prev = o->prev->prev;

    o->children[ 0 ]->next = NULL;
    o->children[ 0 ]->prev = NULL;
    return true;
}